

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O2

void ht_feature_cached_string_destroy(HT_Feature *f)

{
  ht_hash_map_for_each
            ((HT_HashMap *)(f + 2),ht_feature_cached_string_destry_dynamic_labels,(void *)0x0);
  ht_hash_map_deinit((HT_HashMap *)(f + 2));
  ht_hash_map_deinit((HT_HashMap *)(f + 0x1002));
  if (f[1].klass != (HT_FeatureKlass *)0x0) {
    ht_mutex_destroy((HT_Mutex *)f[1].klass);
  }
  ht_free(f);
  return;
}

Assistant:

static void
ht_feature_cached_string_destroy(HT_Feature* f)
{
    HT_FeatureCachedString* feature = (HT_FeatureCachedString*)f;

    ht_hash_map_for_each(&feature->dynamic_hashes, ht_feature_cached_string_destry_dynamic_labels, NULL);

    ht_hash_map_deinit(&feature->dynamic_hashes);
    ht_hash_map_deinit(&feature->static_hashes);
    if (feature->lock)
    {
        ht_mutex_destroy(feature->lock);
    }
    ht_free(feature);
}